

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::
argument_loader<anurbs::Model&,std::shared_ptr<anurbs::Point<3l>>,std::__cxx11::string_const&>::
load_impl_sequence<0ul,1ul,2ul>
          (argument_loader<anurbs::Model&,std::shared_ptr<anurbs::Point<3l>>,std::__cxx11::string_const&>
           *this,long call)

{
  char cVar1;
  bool bVar2;
  undefined8 in_RAX;
  long lVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  bVar2 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x48),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  uStack_18._0_6_ = CONCAT15(bVar2,(undefined5)uStack_18);
  bVar2 = type_caster_generic::
          load_impl<pybind11::detail::copyable_holder_caster<anurbs::Point<3l>,std::shared_ptr<anurbs::Point<3l>>>>
                    ((type_caster_generic *)(this + 0x20),*(PyObject **)(*(long *)(call + 8) + 8),
                     SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
  uStack_18._0_7_ = CONCAT16(bVar2,(undefined6)uStack_18);
  string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          *)this,*(PyObject **)(*(long *)(call + 8) + 0x10),
         SUB41((**(uint **)(call + 0x20) & 4) >> 2,0));
  lVar3 = 0;
  do {
    cVar1 = *(char *)((long)&uStack_18 + lVar3 + 5);
    if (cVar1 != '\x01') {
      return (bool)cVar1;
    }
    bVar2 = lVar3 != 2;
    lVar3 = lVar3 + 1;
  } while (bVar2);
  return true;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
        return true;
    }